

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::cleanUnitString(string *unit_string,uint64_t match_flags)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  uint64_t uVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  const_iterator pvVar10;
  reference pcVar11;
  undefined1 *puVar12;
  bool local_2a9;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_218;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  char *local_208;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_200;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  size_t local_1d0;
  size_type ind;
  size_type bloc_1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  undefined8 local_1b0;
  char local_1a2;
  char local_1a1;
  value_type c2;
  ulong uStack_1a0;
  value_type p;
  size_t seq;
  ulong uStack_190;
  value_type tc2;
  size_type fnd;
  size_type fndP_2;
  size_type dotloc;
  undefined8 local_170;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  eit;
  size_type fnd_2;
  value_type *acode_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  array<std::pair<const_char_*,_const_char_*>,_37UL> *__range2_1;
  size_type bloc;
  size_t loc;
  size_type fndP_1;
  size_type nchar;
  size_type fndP;
  size_t ndiv;
  size_type fdiv;
  size_type ploc;
  size_t reploc;
  size_type fnd_1;
  value_type *acode;
  const_iterator __end2;
  const_iterator __begin2;
  array<std::pair<const_char_*,_const_char_*>,_4UL> *__range2;
  undefined8 local_90;
  undefined8 local_88;
  ulong local_80;
  size_type c;
  size_t sStack_70;
  char tail;
  size_t skipMultiplyInsertionAfter;
  bool skipMultiply;
  bool changed;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  byte local_29;
  long lStack_28;
  bool skipcodereplacement;
  size_type slen;
  uint64_t match_flags_local;
  string *unit_string_local;
  
  slen = match_flags;
  match_flags_local = (uint64_t)unit_string;
  lStack_28 = std::__cxx11::string::size();
  local_29 = (slen & 0x1000000000) != 0;
  if ((cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&cleanUnitString(std::__cxx11::string&,unsigned_long)::
                                   spchar_abi_cxx11_), iVar5 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50," \t\n\r",&local_51);
    std::operator+(&cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_,
                   &local_50,'\0');
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    __cxa_atexit(std::__cxx11::string::~string,
                 &cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&cleanUnitString(std::__cxx11::string&,unsigned_long)::spchar_abi_cxx11_);
  }
  skipMultiplyInsertionAfter._3_1_ = 0;
  skipMultiplyInsertionAfter._2_1_ = 0;
  sStack_70 = 0xffffffffffffffff;
  pcVar7 = (char *)std::__cxx11::string::back();
  c._7_1_ = *pcVar7;
  if (((c._7_1_ == '^') || (c._7_1_ == '*')) || (c._7_1_ == '/')) {
    std::__cxx11::string::pop_back();
    skipMultiplyInsertionAfter._3_1_ = 1;
  }
  local_80 = std::__cxx11::string::find_first_not_of((string *)match_flags_local,0x221e00);
  if (local_80 == 0xffffffffffffffff) {
    std::__cxx11::string::clear();
    return true;
  }
  if (local_80 != 0) {
    std::__cxx11::string::erase(match_flags_local,0);
    local_80 = std::__cxx11::string::find_first_not_of((string *)match_flags_local,0x221e00);
    skipMultiplyInsertionAfter._3_1_ = 1;
  }
  pcVar7 = (char *)std::__cxx11::string::operator[](match_flags_local);
  if (*pcVar7 == '/') {
    std::__cxx11::string::insert(match_flags_local,local_80,'\x01');
    skipMultiplyInsertionAfter._3_1_ = 1;
    skipMultiplyInsertionAfter._2_1_ = 1;
  }
  if ((local_29 & 1) == 0) {
    local_88 = std::__cxx11::string::begin();
    local_90 = std::__cxx11::string::end();
    bVar4 = std::
            any_of<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,units::cleanUnitString(std::__cxx11::string&,unsigned_long)::__0>
                      (local_88,local_90);
    if ((bVar4) && (bVar4 = unicodeReplacement((string *)match_flags_local), bVar4)) {
      skipMultiplyInsertionAfter._3_1_ = 1;
    }
    __begin2 = cleanUnitString::earlyCodeReplacements._M_elems;
    __end2 = std::array<std::pair<const_char_*,_const_char_*>,_4UL>::begin
                       (&cleanUnitString::earlyCodeReplacements);
    acode = std::array<std::pair<const_char_*,_const_char_*>,_4UL>::end
                      (&cleanUnitString::earlyCodeReplacements);
    for (; __end2 != acode; __end2 = __end2 + 1) {
      fnd_1 = (size_type)__end2;
      reploc = std::__cxx11::string::find((char *)match_flags_local,(ulong)__end2->first);
      while (uVar2 = match_flags_local, sVar3 = reploc, reploc != 0xffffffffffffffff) {
        skipMultiplyInsertionAfter._3_1_ = 1;
        pcVar7 = (char *)strlen(*(char **)fnd_1);
        std::__cxx11::string::replace(uVar2,sVar3,pcVar7);
        reploc = std::__cxx11::string::find((char *)match_flags_local,*(ulong *)fnd_1);
      }
    }
    lVar8 = std::__cxx11::string::find_first_of((string *)match_flags_local,0x221e00);
    if (lVar8 != -1) {
      ploc = 0;
      iVar5 = std::__cxx11::string::compare(match_flags_local,0,(char *)0x4);
      if (iVar5 == 0) {
        ploc = 2;
        std::__cxx11::string::replace(match_flags_local,0,(char *)0x4);
        skipMultiplyInsertionAfter._2_1_ = 1;
      }
      bVar4 = ReplaceStringInPlace((string *)match_flags_local," per ",5,"/",1,&ploc);
      if (bVar4) {
        skipMultiplyInsertionAfter._2_1_ = 1;
      }
      if ((ploc != 0) &&
         (fdiv = std::__cxx11::string::find_first_of((char)match_flags_local,0x28),
         fdiv != 0xffffffffffffffff)) {
        ndiv = std::__cxx11::string::find_first_of((char)match_flags_local,0x2f);
        fndP = 0;
        do {
          fndP = std::__cxx11::string::find_first_of((char)match_flags_local,0x2f);
          sVar3 = fndP;
          if (fdiv < fndP) {
            if (fndP == 0xffffffffffffffff) {
              std::__cxx11::string::push_back((char)match_flags_local);
            }
            else {
              std::__cxx11::string::insert(match_flags_local,fndP,'\x01');
            }
            std::__cxx11::string::insert(match_flags_local,ndiv + 1,'\x01');
            sVar3 = fndP + 2;
          }
          ndiv = sVar3;
        } while (fndP != 0xffffffffffffffff);
      }
      checkShortUnits((string *)match_flags_local,slen);
      nchar = std::__cxx11::string::find((char *)match_flags_local,0x1c5367);
      while (nchar != 0xffffffffffffffff) {
        fndP_1 = std::__cxx11::string::find_first_not_of((string *)match_flags_local,0x221e00);
        if ((fndP_1 != 0xffffffffffffffff) &&
           ((pcVar7 = (char *)std::__cxx11::string::operator[](match_flags_local), *pcVar7 == '(' ||
            (pcVar7 = (char *)std::__cxx11::string::operator[](match_flags_local), *pcVar7 == '[')))
           ) {
          sStack_70 = nchar;
          break;
        }
        nchar = std::__cxx11::string::find((char *)match_flags_local,0x1c5367);
      }
      bVar4 = cleanSpaces((string *)match_flags_local,(bool)(skipMultiplyInsertionAfter._2_1_ & 1));
      skipMultiplyInsertionAfter._3_1_ = (skipMultiplyInsertionAfter._3_1_ & 1) != 0 || bVar4;
      uVar9 = std::__cxx11::string::empty();
      if ((uVar9 & 1) != 0) {
        return true;
      }
    }
    checkPowerOf10((string *)match_flags_local);
  }
  else {
    loc = std::__cxx11::string::find((char *)match_flags_local,0x1cc4f4);
    if (loc != 0xffffffffffffffff) {
      sStack_70 = loc;
    }
  }
  pcVar7 = (char *)std::__cxx11::string::front();
  if (*pcVar7 == '(') {
    removeOuterParenthesis((string *)match_flags_local);
    uVar9 = std::__cxx11::string::empty();
    if ((uVar9 & 1) != 0) {
      return true;
    }
  }
  if ((local_29 & 1) == 0) {
    bloc = 0;
    bVar4 = ReplaceStringInPlace((string *)match_flags_local,"**",2,"^",1,&bloc);
    if (bVar4) {
      skipMultiplyInsertionAfter._3_1_ = 1;
    }
  }
  if ((slen & 0x200) != 0) {
    ciConversion((string *)match_flags_local);
    skipMultiplyInsertionAfter._3_1_ = 1;
  }
  if ((local_29 & 1) == 0) {
    lVar8 = std::__cxx11::string::find_last_of((char)match_flags_local,0x3c);
    if (lVar8 != -1) {
      htmlCodeReplacement((string *)match_flags_local);
    }
    __end2_1 = std::array<std::pair<const_char_*,_const_char_*>,_37UL>::begin
                         (&cleanUnitString::allCodeReplacements);
    pvVar10 = std::array<std::pair<const_char_*,_const_char_*>,_37UL>::end
                        (&cleanUnitString::allCodeReplacements);
    for (; __end2_1 != pvVar10; __end2_1 = __end2_1 + 1) {
      eit._M_current = (char *)std::__cxx11::string::find((char *)match_flags_local,__end2_1->first)
      ;
      while (uVar2 = match_flags_local, _Var1._M_current = eit._M_current,
            eit._M_current != (char *)0xffffffffffffffff) {
        skipMultiplyInsertionAfter._3_1_ = 1;
        pcVar7 = (char *)strlen(__end2_1->first);
        std::__cxx11::string::replace(uVar2,(ulong)_Var1._M_current,pcVar7);
        eit._M_current =
             (char *)std::__cxx11::string::find((char *)match_flags_local,__end2_1->first);
      }
    }
  }
  uVar9 = std::__cxx11::string::size();
  if (uVar9 < 2) goto LAB_00191458;
  local_140._M_current = (char *)std::__cxx11::string::end();
  local_138 = __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator-(&local_140,1);
  pcVar11 = __gnu_cxx::
            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*(&local_138);
  if ((*pcVar11 != '2') &&
     (pcVar11 = __gnu_cxx::
                __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&local_138), *pcVar11 != '3')) goto LAB_00191458;
  local_148 = __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator-(&local_138,1);
  pcVar11 = __gnu_cxx::
            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*(&local_148);
  if (*pcVar11 == '-') {
LAB_001912df:
    uVar9 = std::__cxx11::string::size();
    bVar4 = 2 < uVar9;
  }
  else {
    local_150 = __gnu_cxx::
                __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator-(&local_138,1);
    pcVar11 = __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*(&local_150);
    bVar4 = false;
    if (*pcVar11 == '+') goto LAB_001912df;
  }
  if (bVar4) {
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator--(&local_138);
  }
  local_158 = __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator-(&local_138,1);
  pcVar11 = __gnu_cxx::
            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*(&local_158);
  bVar4 = isDigitCharacter(*pcVar11);
  if (((bVar4 ^ 0xffU) & 1) != 0) {
    local_160 = __gnu_cxx::
                __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator-(&local_138,1);
    pcVar11 = __gnu_cxx::
              __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*(&local_160);
    iVar5 = (int)*pcVar11;
    if (iVar5 == 0x2a) {
      local_168 = __gnu_cxx::
                  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator-(&local_138,1);
      pcVar11 = __gnu_cxx::
                __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator*(&local_168);
      *pcVar11 = '^';
    }
    else if ((((iVar5 != 0x2b) && (2 < iVar5 - 0x2dU)) && (iVar5 != 0x45)) &&
            ((iVar5 != 0x5e && (iVar5 != 0x65)))) {
      pcVar11 = __gnu_cxx::
                __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator[](&local_138,0);
      uVar2 = match_flags_local;
      if (*pcVar11 == '+') {
        pcVar11 = __gnu_cxx::
                  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&local_138);
        *pcVar11 = '^';
      }
      else {
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_170,&local_138);
        dotloc = std::__cxx11::string::insert(uVar2,local_170,0x5e);
      }
    }
  }
LAB_00191458:
  if ((local_29 & 1) == 0) {
    fndP_2 = std::__cxx11::string::find_last_of((char)match_flags_local,0x2e);
    if (fndP_2 != 0xffffffffffffffff) {
      pcVar7 = (char *)std::__cxx11::string::operator[](match_flags_local);
      bVar4 = isDigitCharacter(*pcVar7);
      if (!bVar4) {
        cleanDotNotation((string *)match_flags_local,slen);
        skipMultiplyInsertionAfter._3_1_ = 1;
      }
    }
    fnd = std::__cxx11::string::find((char *)match_flags_local,0x1c7888);
    while (fnd != 0xffffffffffffffff) {
      uVar9 = std::__cxx11::string::size();
      if (fnd + 2 < uVar9) {
        pcVar7 = (char *)std::__cxx11::string::operator[](match_flags_local);
        if (*pcVar7 == '^') {
          std::__cxx11::string::replace(match_flags_local,fnd,(char *)0x2);
        }
        else {
          std::__cxx11::string::erase(match_flags_local,fnd);
        }
      }
      else {
        std::__cxx11::string::erase(match_flags_local,fnd);
      }
      fnd = std::__cxx11::string::find((char *)match_flags_local,0x1c7888);
    }
    clearEmptySegments((string *)match_flags_local);
    cleanUpPowersOfOne((string *)match_flags_local);
    uVar9 = std::__cxx11::string::empty();
    if ((uVar9 & 1) != 0) {
      std::__cxx11::string::push_back((char)match_flags_local);
      return true;
    }
  }
  while( true ) {
    uVar6 = std::__cxx11::string::empty();
    bVar4 = false;
    if ((uVar6 & 1) == 0) {
      pcVar7 = (char *)std::__cxx11::string::front();
      bVar4 = true;
      if (*pcVar7 != '*') {
        pcVar7 = (char *)std::__cxx11::string::front();
        bVar4 = true;
        if (*pcVar7 != '}') {
          pcVar7 = (char *)std::__cxx11::string::front();
          bVar4 = true;
          if (*pcVar7 != ')') {
            pcVar7 = (char *)std::__cxx11::string::front();
            bVar4 = *pcVar7 == ']';
          }
        }
      }
    }
    if (!bVar4) break;
    std::__cxx11::string::erase(match_flags_local,0);
    skipMultiplyInsertionAfter._3_1_ = 1;
    uVar9 = std::__cxx11::string::empty();
    if ((uVar9 & 1) != 0) {
      return true;
    }
    pcVar7 = (char *)std::__cxx11::string::front();
    if (*pcVar7 == '(') {
      removeOuterParenthesis((string *)match_flags_local);
    }
  }
  uStack_190 = std::__cxx11::string::find_first_of((char *)match_flags_local,0x1cc4fb);
  do {
    uVar9 = uStack_190;
    lVar8 = std::__cxx11::string::size();
    if (lVar8 - 1U <= uVar9 || sStack_70 <= uStack_190) break;
    puVar12 = (undefined1 *)std::__cxx11::string::operator[](match_flags_local);
    switch(*puVar12) {
    case 0x29:
    case 0x2a:
    case 0x2f:
    case 0x3e:
    case 0x5d:
    case 0x5e:
    case 0x7d:
      uStack_190 = std::__cxx11::string::find_first_of((char *)match_flags_local,0x1cc4fb);
      break;
    default:
switchD_00191752_caseD_2b:
      pcVar7 = (char *)std::__cxx11::string::operator[](match_flags_local);
      if (*pcVar7 == '\\') {
        uStack_190 = std::__cxx11::string::find_first_of((char *)match_flags_local,0x1cc4fb);
      }
      else {
        std::__cxx11::string::insert(match_flags_local,uStack_190 + 1,'\x01');
        uStack_190 = std::__cxx11::string::find_first_of((char *)match_flags_local,0x1cc4fb);
      }
      break;
    case 0x6f:
      uVar9 = std::__cxx11::string::size();
      if (uStack_190 + 3 < uVar9) {
        pcVar7 = (char *)std::__cxx11::string::operator[](match_flags_local);
        seq._7_1_ = *pcVar7;
        pcVar7 = (char *)std::__cxx11::string::operator[](match_flags_local);
        if ((((*pcVar7 == 'f') && (seq._7_1_ != ')')) && (seq._7_1_ != ']')) && (seq._7_1_ != '}'))
        {
          uStack_190 = std::__cxx11::string::find_first_of((char *)match_flags_local,0x1cc4fb);
          break;
        }
      }
      std::__cxx11::string::insert(match_flags_local,uStack_190 + 1,'\x01');
      uStack_190 = std::__cxx11::string::find_first_of((char *)match_flags_local,0x1cc4fb);
      break;
    case 0x7b:
      pcVar7 = (char *)std::__cxx11::string::operator[](match_flags_local);
      if (*pcVar7 == '}') goto switchD_00191752_caseD_2b;
      uStack_190 = std::__cxx11::string::find_first_of((char *)match_flags_local,0x1cc4fb);
    }
  } while( true );
  uStack_190 = std::__cxx11::string::find_first_of((char)match_flags_local,0x5e);
  while (uVar9 = uStack_190, lVar8 = std::__cxx11::string::size(),
        uVar9 < lVar8 - 3U && uStack_190 < sStack_70) {
    pcVar7 = (char *)std::__cxx11::string::operator[](match_flags_local);
    if (*pcVar7 == '-') {
      uStack_190 = uStack_190 + 1;
    }
    uVar9 = uStack_190;
    lVar8 = std::__cxx11::string::size();
    if (uVar9 < lVar8 - 3U) {
      uStack_1a0 = 1;
      pcVar7 = (char *)std::__cxx11::string::operator[](match_flags_local);
      local_1a1 = *pcVar7;
      while( true ) {
        bVar4 = false;
        if (('/' < local_1a1) && (bVar4 = false, local_1a1 < ':')) {
          uVar9 = uStack_190 + uStack_1a0;
          lVar8 = std::__cxx11::string::size();
          bVar4 = uVar9 <= lVar8 - 1U;
        }
        if (!bVar4) break;
        uStack_1a0 = uStack_1a0 + 1;
        pcVar7 = (char *)std::__cxx11::string::operator[](match_flags_local);
        local_1a1 = *pcVar7;
      }
      uVar9 = uStack_190 + uStack_1a0;
      lVar8 = std::__cxx11::string::size();
      if (lVar8 - 1U < uVar9) break;
      if (1 < uStack_1a0) {
        pcVar7 = (char *)std::__cxx11::string::operator[](match_flags_local);
        local_1a2 = *pcVar7;
        if (((((local_1a2 != '\0') && (local_1a2 != '*')) && (local_1a2 != '/')) &&
            ((local_1a2 != '^' && (local_1a2 != 'e')))) && (local_1a2 != 'E')) {
          std::__cxx11::string::insert(match_flags_local,uStack_190 + uStack_1a0,'\x01');
        }
      }
    }
    uStack_190 = std::__cxx11::string::find_first_of((char)match_flags_local,0x5e);
  }
  uVar9 = std::__cxx11::string::empty();
  if (((uVar9 & 1) == 0) &&
     (pcVar7 = (char *)std::__cxx11::string::front(), uVar2 = match_flags_local, *pcVar7 == '/')) {
    local_1b8._M_current = (char *)std::__cxx11::string::begin();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_1b0,&local_1b8);
    bloc_1 = std::__cxx11::string::insert(uVar2,local_1b0,0x31);
    skipMultiplyInsertionAfter._3_1_ = 1;
  }
  if ((local_29 & 1) == 0) {
    ind = std::__cxx11::string::find_first_of((char)match_flags_local,0x7b);
    while (ind != 0xffffffffffffffff) {
      local_1d0 = ind + 1;
      bVar4 = segmentcheck((string *)match_flags_local,'}',&local_1d0);
      if (bVar4) {
        local_1e8._M_current = (char *)std::__cxx11::string::begin();
        local_1e0 = __gnu_cxx::
                    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator+(&local_1e8,ind);
        local_1d8 = __gnu_cxx::
                    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator+(&local_1e0,1);
        local_200._M_current = (char *)std::__cxx11::string::begin();
        local_1f8 = __gnu_cxx::
                    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator+(&local_200,local_1d0);
        local_1f0 = __gnu_cxx::
                    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator-(&local_1f8,1);
        local_218._M_current = (char *)std::__cxx11::string::begin();
        local_210 = __gnu_cxx::
                    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator+(&local_218,ind);
        local_208 = (char *)__gnu_cxx::
                            __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator+(&local_210,1);
        std::
        transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                  (local_1d8,local_1f0,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )local_208,tolower);
        ind = std::__cxx11::string::find_first_of((char)match_flags_local,0x7b);
      }
      else {
        ind = 0xffffffffffffffff;
      }
    }
  }
  local_2a9 = true;
  if ((skipMultiplyInsertionAfter._3_1_ & 1) == 0) {
    lVar8 = std::__cxx11::string::size();
    local_2a9 = lVar8 != lStack_28;
  }
  return local_2a9;
}

Assistant:

static bool cleanUnitString(std::string& unit_string, std::uint64_t match_flags)
{
    auto slen = unit_string.size();
    bool skipcodereplacement = ((match_flags & skip_code_replacements) != 0);
    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<ckpair, 4>
        earlyCodeReplacements{{
            ckpair{"degree", "deg"},
            ckpair{"Degree", "deg"},
            ckpair{"degs ", "deg"},
            ckpair{"deg ", "deg"},
        }};

    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<ckpair, 37>
        allCodeReplacements{{
            ckpair{"sq.", "square"},
            ckpair{"cu.", "cubic"},
            ckpair{"U.S.A.", "US"},
            ckpair{"U.S.", "US"},
            ckpair{"10^", "1e"},
            ckpair{"10-", "1e-"},
            ckpair{"^+", "^"},
            ckpair{"'s", "s"},
            ckpair{"ampere", "amp"},
            ckpair{"Ampere", "amp"},
            ckpair{"metre", "meter"},
            ckpair{"Metre", "meter"},
            ckpair{"litre", "liter"},
            ckpair{"Litre", "liter"},
            ckpair{"B.Th.U.", "BTU"},
            ckpair{"B.T.U.", "BTU"},
            ckpair{"Britishthermalunits", "BTU"},
            ckpair{"Britishthermalunitat", "BTU"},
            ckpair{"Britishthermalunit", "BTU"},
            ckpair{"BritishThermalUnits", "BTU"},
            ckpair{"BritishThermalUnitAt", "BTU"},
            ckpair{"BritishThermalUnit", "BTU"},
            ckpair{"BThU", "BTU"},
            ckpair{"-US", "US"},
            ckpair{"--", "*"},
            // -- is either a double negative or a separator, so make it a
            // multiplier so it doesn't get erased and then converted to a
            // power
            ckpair{"\\\\", "\\\\*"},
            // \\ is always considered a segment terminator so it won't be
            // misinterpreted as a known escape sequence
            ckpair{"perunit", "pu"},
            ckpair{"percent", "%"},
            ckpair{"per-unit", "pu"},
            ckpair{"per unit ", "pu"},
            ckpair{"/square*", "/square"},
            ckpair{"/cubic*", "/cubic"},
            ckpair{"Hz^0.5", "rootHertz"},
            ckpair{"Hz^.5", "rootHertz"},
            ckpair{"Hz^(1/2)", "rootHertz"},
            ckpair{"Hz^1/2", "rootHertz"},
            ckpair{u8"\u221AHz", "rootHertz"},
        }};

    static const std::string spchar = std::string(" \t\n\r") + '\0';
    bool changed = false;
    bool skipMultiply = false;
    std::size_t skipMultiplyInsertionAfter{std::string::npos};
    char tail = unit_string.back();
    if (tail == '^' || tail == '*' || tail == '/') {
        unit_string.pop_back();
        changed = true;
    }
    auto c = unit_string.find_first_not_of(spchar);
    if (c == std::string::npos) {
        unit_string.clear();
        return true;
    }
    if (c != 0) {
        unit_string.erase(0, c);
        c = unit_string.find_first_not_of(spchar);
        changed = true;
    }
    if (unit_string[c] == '/') {
        unit_string.insert(c, 1, '1');
        changed = true;
        skipMultiply = true;
    }
    if (!skipcodereplacement) {
        // Check for unicode or extended characters
        if (std::any_of(unit_string.begin(), unit_string.end(), [](char x) {
                return (static_cast<std::uint8_t>(x) & 0x80U) != 0;
            })) {
            if (unicodeReplacement(unit_string)) {
                changed = true;
            }
        }

        // some code replacement that needs to be done before single character
        // and space replacements
        for (const auto& acode : earlyCodeReplacements) {
            auto fnd = unit_string.find(acode.first);
            while (fnd != std::string::npos) {
                changed = true;
                unit_string.replace(fnd, strlen(acode.first), acode.second);
                fnd = unit_string.find(acode.first, fnd + 1);
            }
        }

        if (unit_string.find_first_of(spchar) != std::string::npos) {
            // deal with some particular string with a space in them
            std::size_t reploc{0};
            // clean up some "per" words
            if (unit_string.compare(0, 4, "per ") == 0) {
                reploc = 2;
                unit_string.replace(0, 4, "1/");
                skipMultiply = true;
            }
            if (ReplaceStringInPlace(unit_string, " per ", 5, "/", 1, reploc)) {
                skipMultiply = true;
            }
            if (reploc > 0) {
                auto ploc = unit_string.find_first_of('(', reploc);
                if (ploc != std::string::npos) {
                    auto fdiv = unit_string.find_first_of('/', reploc);
                    std::size_t ndiv{0};
                    do {
                        ndiv = unit_string.find_first_of('/', fdiv + 1);
                        if (ploc < ndiv) {
                            if (ndiv != std::string::npos) {
                                unit_string.insert(ndiv, 1, ')');
                            } else {
                                unit_string.push_back(')');
                            }
                            unit_string.insert(fdiv + 1, 1, '(');
                            fdiv = ndiv + 2;
                        } else {
                            fdiv = ndiv;
                        }
                    } while (ndiv != std::string::npos);
                }
            }
            checkShortUnits(unit_string, match_flags);
            auto fndP = unit_string.find(" of ");
            while (fndP != std::string::npos) {
                auto nchar = unit_string.find_first_not_of(spchar, fndP + 4);
                if (nchar != std::string::npos) {
                    if (unit_string[nchar] == '(' ||
                        unit_string[nchar] == '[') {
                        skipMultiplyInsertionAfter = fndP;
                        break;
                    }
                }
                fndP = unit_string.find(" of ", fndP + 3);
            }
            changed |= cleanSpaces(unit_string, skipMultiply);
            if (unit_string.empty()) {
                // LCOV_EXCL_START
                return true;
                // LCOV_EXCL_STOP
            }
        }

        checkPowerOf10(unit_string);
    } else {
        auto fndP = unit_string.find("of(");
        if (fndP != std::string::npos) {
            skipMultiplyInsertionAfter = fndP;
        }
    }
    if (unit_string.front() == '(') {
        removeOuterParenthesis(unit_string);
        if (unit_string.empty()) {
            return true;
        }
    }

    if (!skipcodereplacement) {
        // ** means power in some environments
        std::size_t loc{0};
        if (ReplaceStringInPlace(unit_string, "**", 2, "^", 1, loc)) {
            changed = true;
        }
    }
    if ((match_flags & case_insensitive) != 0) {
        ciConversion(unit_string);
        changed = true;
    }
    if (!skipcodereplacement) {
        // deal with some html stuff
        auto bloc = unit_string.find_last_of('<');
        if (bloc != std::string::npos) {
            htmlCodeReplacement(unit_string);
        }
        // some abbreviations and other problematic code replacements
        for (const auto& acode : allCodeReplacements) {
            auto fnd = unit_string.find(acode.first);
            while (fnd != std::string::npos) {
                changed = true;
                unit_string.replace(fnd, strlen(acode.first), acode.second);
                fnd = unit_string.find(acode.first, fnd + 1);
            }
        }
    }
    if (unit_string.size() >= 2) {
        auto eit = unit_string.end() - 1;
        if (*(eit) == '2' || *(eit) == '3') {
            if ((*(eit - 1) == '-' || *(eit - 1) == '+') &&
                unit_string.size() >= 3) {
                --eit;
            }
            if (!isDigitCharacter(*(eit - 1))) {
                switch (*(eit - 1)) {
                    case '^':
                    case 'e':
                    case 'E':
                    case '/':
                    case '+':
                    case '-':
                    case '.':
                        break;
                    case '*':
                        *(eit - 1) = '^';
                        break;
                    default:
                        if (eit[0] != '+') {
                            unit_string.insert(eit, '^');
                        } else {
                            *eit = '^';
                        }

                        break;
                }
            }
        }
    }
    if (!skipcodereplacement) {
        // handle dot notation for multiplication
        auto dotloc = unit_string.find_last_of('.');
        if (dotloc < std::string::npos) {
            // strings always have a null pointer at the end
            if (!isDigitCharacter(unit_string[dotloc + 1])) {
                cleanDotNotation(unit_string, match_flags);
                changed = true;
            }
        }

        // clear empty parenthesis
        auto fndP = unit_string.find("()");
        while (fndP != std::string::npos) {
            if (unit_string.size() > fndP + 2) {
                if (unit_string[fndP + 2] == '^') {
                    unit_string.replace(fndP, 2, "*1");
                } else {
                    unit_string.erase(fndP, 2);
                }
            } else {
                unit_string.erase(fndP, 2);
            }
            fndP = unit_string.find("()", fndP);
        }
        // clear empty brackets, this would indicate commodities but if
        // empty there is no commodity
        clearEmptySegments(unit_string);
        cleanUpPowersOfOne(unit_string);
        if (unit_string.empty()) {
            unit_string.push_back('1');
            return true;
        }
    }
    // remove leading *})],  equivalent of 1* but we don't need to process
    // that further
    while (!unit_string.empty() &&
           (unit_string.front() == '*' || unit_string.front() == '}' ||
            unit_string.front() == ')' || unit_string.front() == ']')) {
        unit_string.erase(0, 1);
        changed = true;
        if (unit_string.empty()) {
            return true;
        }
        // check for parenthesis again
        if (unit_string.front() == '(') {
            removeOuterParenthesis(unit_string);
        }
    }
    // inject multiplies after bracket terminators
    auto fnd = unit_string.find_first_of(")]}");
    while (fnd < unit_string.size() - 1 && fnd < skipMultiplyInsertionAfter) {
        switch (unit_string[fnd + 1]) {
            case '^':
            case '*':
            case '/':
            case ')':
            case ']':
            case '}':
            case '>':
                fnd = unit_string.find_first_of(")]}", fnd + 1);
                break;
            case 'o':  // handle special case of commodity modifier using
                       // "of"
                if (unit_string.size() > fnd + 3) {
                    auto tc2 = unit_string[fnd + 3];
                    if (unit_string[fnd + 2] == 'f' && tc2 != ')' &&
                        tc2 != ']' && tc2 != '}') {
                        fnd = unit_string.find_first_of(")]}", fnd + 3);
                        break;
                    }
                }
                unit_string.insert(fnd + 1, 1, '*');
                fnd = unit_string.find_first_of(")]}", fnd + 3);
                break;
            case '{':
                if (unit_string[fnd] != '}') {
                    fnd = unit_string.find_first_of(")]}", fnd + 1);
                    break;
                }
                /* FALLTHRU */
            default:
                if (unit_string[fnd - 1] == '\\') {  // ignore escape sequences
                    fnd = unit_string.find_first_of(")]}", fnd + 1);
                    break;
                }
                unit_string.insert(fnd + 1, 1, '*');
                fnd = unit_string.find_first_of(")]}", fnd + 2);
                break;
        }
    }
    // insert multiplies after ^#
    fnd = unit_string.find_first_of('^');
    while (fnd < unit_string.size() - 3 && fnd < skipMultiplyInsertionAfter) {
        if (unit_string[fnd + 1] == '-') {
            ++fnd;
        }
        if (fnd < unit_string.size() - 3) {
            std::size_t seq = 1;
            auto p = unit_string[fnd + seq];
            while (p >= '0' && p <= '9' &&
                   fnd + seq <= unit_string.size() - 1U) {
                ++seq;
                p = unit_string[fnd + seq];
            }
            if (fnd + seq > unit_string.size() - 1U) {
                break;
            }
            if (seq > 1) {
                auto c2 = unit_string[fnd + seq];
                if (c2 != '\0' && c2 != '*' && c2 != '/' && c2 != '^' &&
                    c2 != 'e' && c2 != 'E') {
                    unit_string.insert(fnd + seq, 1, '*');
                }
            }
        }
        fnd = unit_string.find_first_of('^', fnd + 2);
    }

    // this still might occur from code replacements or other removal
    if (!unit_string.empty() && unit_string.front() == '/') {
        unit_string.insert(unit_string.begin(), '1');
        changed = true;
    }
    if (!skipcodereplacement) {  // make everything inside {} lower case
        auto bloc = unit_string.find_first_of('{');
        while (bloc != std::string::npos) {
            auto ind = bloc + 1;
            if (segmentcheck(unit_string, '}', ind)) {
                std::transform(
                    unit_string.begin() + bloc + 1,
                    unit_string.begin() + ind - 1,
                    unit_string.begin() + bloc + 1,
                    ::tolower);
                bloc = unit_string.find_first_of('{', ind);
            } else {
                bloc = std::string::npos;
            }
        }
    }
    return (changed || unit_string.size() != slen);
}